

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseCoDim
          (SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,SPxId *enterId)

{
  uint *puVar1;
  int i;
  pointer pnVar2;
  undefined8 uVar3;
  int iVar4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  DataKey DVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  lVar8 = (long)(((this->
                  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver)->infeasibilitiesCo).super_IdxSet.num;
  if (0 < lVar8) {
    uVar9 = lVar8 + 1;
    do {
      pSVar5 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      pnVar2 = (pSVar5->theTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar7 = (pSVar5->infeasibilitiesCo).super_IdxSet.idx;
      i = piVar7[uVar9 - 2];
      local_a8.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar2[i].m_backend.data + 0x20);
      local_a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[i].m_backend.data;
      local_a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar2[i].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x10);
      local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_a8.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_a8.exp = pnVar2[i].m_backend.exp;
      local_a8.neg = pnVar2[i].m_backend.neg;
      local_a8.fpclass = pnVar2[i].m_backend.fpclass;
      local_a8.prec_elem = pnVar2[i].m_backend.prec_elem;
      local_68.data._M_elems._32_8_ =
           *(undefined8 *)
            ((this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.data._M_elems + 8);
      local_68.data._M_elems._0_8_ =
           *(undefined8 *)
            (this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems;
      local_68.data._M_elems._8_8_ =
           *(undefined8 *)
            ((this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.data._M_elems + 2);
      local_68.data._M_elems._16_8_ =
           *(undefined8 *)
            ((this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.data._M_elems + 4);
      local_68.data._M_elems._24_8_ =
           *(undefined8 *)
            ((this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.data._M_elems + 6);
      local_68.exp = (this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thetolerance.m_backend.exp;
      local_68.neg = (this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thetolerance.m_backend.neg;
      local_68.fpclass =
           (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.fpclass;
      local_68.prec_elem =
           (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.prec_elem;
      if (local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) {
        local_68.neg = (bool)(local_68.neg ^ 1);
      }
      if (local_a8.fpclass == cpp_dec_float_NaN || local_68.fpclass == cpp_dec_float_NaN) {
LAB_002a29a1:
        iVar4 = (pSVar5->infeasibilitiesCo).super_IdxSet.num;
        (pSVar5->infeasibilitiesCo).super_IdxSet.num = iVar4 + -1;
        piVar7[uVar9 - 2] = piVar7[(long)iVar4 + -1];
        (pSVar5->isInfeasibleCo).data[i] = 0;
      }
      else {
        iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_a8,&local_68);
        if (-1 < iVar4) {
          pSVar5 = (this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          piVar7 = (pSVar5->infeasibilitiesCo).super_IdxSet.idx;
          goto LAB_002a29a1;
        }
        if (((local_a8.fpclass != cpp_dec_float_NaN) &&
            ((best->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_a8,&best->m_backend), iVar4 < 0)) {
          DVar6 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ::id((this->
                                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).thesolver,i);
          enterId->super_DataKey = DVar6;
          *(undefined8 *)(best->m_backend).data._M_elems = local_a8.data._M_elems._0_8_;
          *(undefined8 *)((best->m_backend).data._M_elems + 2) = local_a8.data._M_elems._8_8_;
          *(undefined8 *)((best->m_backend).data._M_elems + 4) = local_a8.data._M_elems._16_8_;
          *(ulong *)((best->m_backend).data._M_elems + 6) =
               CONCAT35(local_a8.data._M_elems[7]._1_3_,local_a8.data._M_elems._24_5_);
          *(undefined8 *)((best->m_backend).data._M_elems + 8) = local_a8.data._M_elems._32_8_;
          (best->m_backend).exp = local_a8.exp;
          (best->m_backend).neg = local_a8.neg;
          (best->m_backend).fpclass = local_a8.fpclass;
          (best->m_backend).prec_elem = local_a8.prec_elem;
        }
      }
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
  }
  return (SPxId)enterId->super_DataKey;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterSparseCoDim(R& best, SPxId& enterId)
{
   assert(this->thesolver != nullptr);

   int idx;
   R x;

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = this->thesolver->test()[idx];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            enterId = this->thesolver->id(idx);
            best = x;
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         assert(this->thesolver->isInfeasibleCo[idx] > 0);
         this->thesolver->isInfeasibleCo[idx] = 0;
      }
   }

   return enterId;
}